

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  BufferView<embree::Vec3fx> *pBVar15;
  char *pcVar16;
  size_t sVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar22;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar23;
  undefined1 auVar24 [32];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  long lVar34;
  long lVar35;
  unsigned_long uVar36;
  long lVar37;
  ulong uVar38;
  undefined4 uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  float fVar44;
  float fVar45;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar68;
  undefined1 auVar67 [32];
  float fVar70;
  undefined1 auVar69 [64];
  undefined1 auVar71 [16];
  float fVar73;
  undefined1 auVar72 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  size_t local_258;
  size_t local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar38 = r->_begin;
  uVar36 = r->_end;
  if (uVar38 < uVar36) {
    local_248._8_4_ = 0xff800000;
    local_248._0_8_ = 0xff800000ff800000;
    local_248._12_4_ = 0xff800000;
    auVar69 = ZEXT1664(local_248);
    local_238._8_4_ = 0x7f800000;
    local_238._0_8_ = 0x7f8000007f800000;
    local_238._12_4_ = 0x7f800000;
    auVar72 = ZEXT1664(local_238);
    local_258 = 0;
    auVar81 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar74._8_4_ = 0x5dccb9a2;
    auVar74._0_8_ = 0x5dccb9a25dccb9a2;
    auVar74._12_4_ = 0x5dccb9a2;
    auVar75._8_4_ = 0xddccb9a2;
    auVar75._0_8_ = 0xddccb9a2ddccb9a2;
    auVar75._12_4_ = 0xddccb9a2;
    local_250 = k;
    do {
      pBVar15 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                vertices.items;
      uVar14 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar38);
      uVar42 = (ulong)(uVar14 + 3);
      if (uVar42 < (pBVar15->super_RawBufferView).num) {
        lVar35 = 0;
        do {
          lVar41 = *(long *)((long)&(pBVar15->super_RawBufferView).ptr_ofs + lVar35);
          lVar43 = *(long *)((long)&(pBVar15->super_RawBufferView).stride + lVar35);
          lVar40 = lVar43 * (ulong)uVar14;
          lVar37 = lVar43 * (ulong)(uVar14 + 1);
          lVar34 = lVar43 * (ulong)(uVar14 + 2);
          auVar61 = vinsertps_avx(ZEXT416(*(uint *)(lVar41 + 0xc + lVar40)),
                                  ZEXT416(*(uint *)(lVar41 + 0xc + lVar37)),0x10);
          auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(lVar41 + 0xc + lVar34)),0x20);
          auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(lVar41 + 0xc + lVar43 * uVar42)),0x30);
          auVar61 = vandps_avx(auVar81._0_16_,auVar61);
          auVar61 = vcmpps_avx(auVar61,auVar74,5);
          if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar61[0xf] < '\0') goto LAB_01238a48;
          auVar61 = *(undefined1 (*) [16])(lVar41 + lVar40);
          auVar71 = vcmpps_avx(auVar61,auVar75,6);
          auVar61 = vcmpps_avx(auVar61,auVar74,1);
          auVar61 = vandps_avx(auVar71,auVar61);
          uVar39 = vmovmskps_avx(auVar61);
          if ((~(byte)uVar39 & 7) != 0) goto LAB_01238a48;
          auVar61 = *(undefined1 (*) [16])(lVar41 + lVar37);
          auVar71 = vcmpps_avx(auVar61,auVar75,6);
          auVar61 = vcmpps_avx(auVar61,auVar74,1);
          auVar61 = vandps_avx(auVar71,auVar61);
          uVar39 = vmovmskps_avx(auVar61);
          if ((~(byte)uVar39 & 7) != 0) goto LAB_01238a48;
          auVar61 = *(undefined1 (*) [16])(lVar41 + lVar34);
          auVar71 = vcmpps_avx(auVar61,auVar75,6);
          auVar61 = vcmpps_avx(auVar61,auVar74,1);
          auVar61 = vandps_avx(auVar71,auVar61);
          uVar39 = vmovmskps_avx(auVar61);
          if ((~(byte)uVar39 & 7) != 0) goto LAB_01238a48;
          auVar61 = *(undefined1 (*) [16])(lVar41 + lVar43 * uVar42);
          auVar71 = vcmpps_avx(auVar61,auVar75,6);
          auVar61 = vcmpps_avx(auVar61,auVar74,1);
          auVar61 = vandps_avx(auVar71,auVar61);
          uVar39 = vmovmskps_avx(auVar61);
          if ((~(byte)uVar39 & 7) != 0) goto LAB_01238a48;
          lVar35 = lVar35 + 0x38;
        } while ((ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar35);
        pcVar16 = (pBVar15->super_RawBufferView).ptr_ofs;
        sVar17 = (pBVar15->super_RawBufferView).stride;
        lVar41 = (uVar14 + 1) * sVar17;
        lVar35 = (uVar14 + 2) * sVar17;
        lVar43 = uVar42 * sVar17;
        fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                maxRadiusScale;
        fVar2 = *(float *)(pcVar16 + lVar41);
        fVar3 = *(float *)(pcVar16 + lVar35);
        fVar4 = *(float *)(pcVar16 + lVar35 + 4);
        fVar5 = *(float *)(pcVar16 + lVar35 + 8);
        auVar61 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar16 + lVar35 + 0xc))),
                              ZEXT416((uint)(fVar1 * *(float *)(pcVar16 + lVar35 + 0xc))),0);
        fVar6 = *(float *)(pcVar16 + lVar43);
        fVar7 = *(float *)(pcVar16 + lVar43 + 4);
        fVar8 = *(float *)(pcVar16 + lVar43 + 8);
        auVar71 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar16 + lVar43 + 0xc))),
                              ZEXT416((uint)(fVar1 * *(float *)(pcVar16 + lVar43 + 0xc))),0);
        fVar87 = auVar71._0_4_;
        fVar88 = auVar71._4_4_;
        fVar89 = auVar71._8_4_;
        fVar83 = auVar61._0_4_;
        fVar84 = auVar61._4_4_;
        fVar85 = auVar61._8_4_;
        fVar86 = auVar61._12_4_;
        fVar68 = (float)catmullrom_basis0._2816_4_ + fVar8 + fVar6;
        fVar9 = *(float *)(pcVar16 + lVar41 + 4);
        fVar70 = (float)catmullrom_basis0._3972_4_ + fVar8 + auVar69._28_4_;
        fVar10 = *(float *)(pcVar16 + lVar41 + 8);
        auVar61 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar16 + lVar41 + 0xc))),
                              ZEXT416((uint)(fVar1 * *(float *)(pcVar16 + lVar41 + 0xc))),0);
        fVar25 = auVar61._0_4_;
        fVar26 = auVar61._4_4_;
        fVar27 = auVar61._8_4_;
        lVar35 = uVar14 * sVar17;
        fVar11 = *(float *)(pcVar16 + lVar35);
        fVar44 = fVar11 * (float)catmullrom_basis0._476_4_ +
                 (float)catmullrom_basis0._1632_4_ * fVar2 +
                 fVar3 * (float)catmullrom_basis0._2788_4_ +
                 fVar6 * (float)catmullrom_basis0._3944_4_;
        fVar48 = fVar11 * (float)catmullrom_basis0._480_4_ +
                 (float)catmullrom_basis0._1636_4_ * fVar2 +
                 fVar3 * (float)catmullrom_basis0._2792_4_ +
                 fVar6 * (float)catmullrom_basis0._3948_4_;
        fVar50 = fVar11 * (float)catmullrom_basis0._484_4_ +
                 (float)catmullrom_basis0._1640_4_ * fVar2 +
                 fVar3 * (float)catmullrom_basis0._2796_4_ +
                 fVar6 * (float)catmullrom_basis0._3952_4_;
        fVar52 = fVar11 * (float)catmullrom_basis0._488_4_ +
                 (float)catmullrom_basis0._1644_4_ * fVar2 +
                 fVar3 * (float)catmullrom_basis0._2800_4_ +
                 fVar6 * (float)catmullrom_basis0._3956_4_;
        fVar54 = fVar11 * (float)catmullrom_basis0._492_4_ +
                 (float)catmullrom_basis0._1648_4_ * fVar2 +
                 fVar3 * (float)catmullrom_basis0._2804_4_ +
                 fVar6 * (float)catmullrom_basis0._3960_4_;
        fVar56 = fVar11 * (float)catmullrom_basis0._496_4_ +
                 (float)catmullrom_basis0._1652_4_ * fVar2 +
                 fVar3 * (float)catmullrom_basis0._2808_4_ +
                 fVar6 * (float)catmullrom_basis0._3964_4_;
        fVar58 = fVar11 * (float)catmullrom_basis0._500_4_ +
                 (float)catmullrom_basis0._1656_4_ * fVar2 +
                 fVar3 * (float)catmullrom_basis0._2812_4_ +
                 fVar6 * (float)catmullrom_basis0._3968_4_;
        fVar60 = (float)catmullrom_basis0._1660_4_ + fVar68;
        fVar12 = *(float *)(pcVar16 + lVar35 + 4);
        fVar45 = fVar12 * (float)catmullrom_basis0._476_4_ +
                 (float)catmullrom_basis0._1632_4_ * fVar9 +
                 fVar4 * (float)catmullrom_basis0._2788_4_ +
                 fVar7 * (float)catmullrom_basis0._3944_4_;
        fVar49 = fVar12 * (float)catmullrom_basis0._480_4_ +
                 (float)catmullrom_basis0._1636_4_ * fVar9 +
                 fVar4 * (float)catmullrom_basis0._2792_4_ +
                 fVar7 * (float)catmullrom_basis0._3948_4_;
        fVar51 = fVar12 * (float)catmullrom_basis0._484_4_ +
                 (float)catmullrom_basis0._1640_4_ * fVar9 +
                 fVar4 * (float)catmullrom_basis0._2796_4_ +
                 fVar7 * (float)catmullrom_basis0._3952_4_;
        fVar53 = fVar12 * (float)catmullrom_basis0._488_4_ +
                 (float)catmullrom_basis0._1644_4_ * fVar9 +
                 fVar4 * (float)catmullrom_basis0._2800_4_ +
                 fVar7 * (float)catmullrom_basis0._3956_4_;
        fVar55 = fVar12 * (float)catmullrom_basis0._492_4_ +
                 (float)catmullrom_basis0._1648_4_ * fVar9 +
                 fVar4 * (float)catmullrom_basis0._2804_4_ +
                 fVar7 * (float)catmullrom_basis0._3960_4_;
        fVar57 = fVar12 * (float)catmullrom_basis0._496_4_ +
                 (float)catmullrom_basis0._1652_4_ * fVar9 +
                 fVar4 * (float)catmullrom_basis0._2808_4_ +
                 fVar7 * (float)catmullrom_basis0._3964_4_;
        fVar59 = fVar12 * (float)catmullrom_basis0._500_4_ +
                 (float)catmullrom_basis0._1656_4_ * fVar9 +
                 fVar4 * (float)catmullrom_basis0._2812_4_ +
                 fVar7 * (float)catmullrom_basis0._3968_4_;
        fVar68 = fVar68 + fVar70;
        fVar13 = *(float *)(pcVar16 + lVar35 + 8);
        auVar90._0_4_ =
             (float)catmullrom_basis0._1632_4_ * fVar10 +
             fVar5 * (float)catmullrom_basis0._2788_4_ + fVar8 * (float)catmullrom_basis0._3944_4_ +
             (float)catmullrom_basis0._476_4_ * fVar13;
        auVar90._4_4_ =
             (float)catmullrom_basis0._1636_4_ * fVar10 +
             fVar5 * (float)catmullrom_basis0._2792_4_ + fVar8 * (float)catmullrom_basis0._3948_4_ +
             (float)catmullrom_basis0._480_4_ * fVar13;
        auVar90._8_4_ =
             (float)catmullrom_basis0._1640_4_ * fVar10 +
             fVar5 * (float)catmullrom_basis0._2796_4_ + fVar8 * (float)catmullrom_basis0._3952_4_ +
             (float)catmullrom_basis0._484_4_ * fVar13;
        auVar90._12_4_ =
             (float)catmullrom_basis0._1644_4_ * fVar10 +
             fVar5 * (float)catmullrom_basis0._2800_4_ + fVar8 * (float)catmullrom_basis0._3956_4_ +
             (float)catmullrom_basis0._488_4_ * fVar13;
        auVar90._16_4_ =
             (float)catmullrom_basis0._1648_4_ * fVar10 +
             fVar5 * (float)catmullrom_basis0._2804_4_ + fVar8 * (float)catmullrom_basis0._3960_4_ +
             (float)catmullrom_basis0._492_4_ * fVar13;
        auVar90._20_4_ =
             (float)catmullrom_basis0._1652_4_ * fVar10 +
             fVar5 * (float)catmullrom_basis0._2808_4_ + fVar8 * (float)catmullrom_basis0._3964_4_ +
             (float)catmullrom_basis0._496_4_ * fVar13;
        auVar90._24_4_ =
             (float)catmullrom_basis0._1656_4_ * fVar10 +
             fVar5 * (float)catmullrom_basis0._2812_4_ + fVar8 * (float)catmullrom_basis0._3968_4_ +
             (float)catmullrom_basis0._500_4_ * fVar13;
        auVar90._28_4_ = fVar86 + fVar8 + auVar72._28_4_ + fVar70;
        auVar47 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar16 + lVar35 + 0xc))),
                              ZEXT416((uint)(fVar1 * *(float *)(pcVar16 + lVar35 + 0xc))),0);
        fVar1 = auVar47._0_4_;
        fVar70 = auVar47._4_4_;
        fVar28 = auVar47._8_4_;
        auVar82._0_4_ =
             (float)catmullrom_basis0._476_4_ * fVar1 +
             (float)catmullrom_basis0._1632_4_ * fVar25 +
             fVar83 * (float)catmullrom_basis0._2788_4_ + fVar87 * (float)catmullrom_basis0._3944_4_
        ;
        auVar82._4_4_ =
             (float)catmullrom_basis0._480_4_ * fVar70 +
             (float)catmullrom_basis0._1636_4_ * fVar26 +
             fVar84 * (float)catmullrom_basis0._2792_4_ + fVar88 * (float)catmullrom_basis0._3948_4_
        ;
        auVar82._8_4_ =
             (float)catmullrom_basis0._484_4_ * fVar28 +
             (float)catmullrom_basis0._1640_4_ * fVar27 +
             fVar85 * (float)catmullrom_basis0._2796_4_ + fVar89 * (float)catmullrom_basis0._3952_4_
        ;
        auVar82._12_4_ =
             (float)catmullrom_basis0._488_4_ * auVar47._12_4_ +
             (float)catmullrom_basis0._1644_4_ * auVar61._12_4_ +
             fVar86 * (float)catmullrom_basis0._2800_4_ +
             auVar71._12_4_ * (float)catmullrom_basis0._3956_4_;
        auVar82._16_4_ =
             (float)catmullrom_basis0._492_4_ * fVar1 +
             (float)catmullrom_basis0._1648_4_ * fVar25 +
             fVar83 * (float)catmullrom_basis0._2804_4_ + fVar87 * (float)catmullrom_basis0._3960_4_
        ;
        auVar82._20_4_ =
             (float)catmullrom_basis0._496_4_ * fVar70 +
             (float)catmullrom_basis0._1652_4_ * fVar26 +
             fVar84 * (float)catmullrom_basis0._2808_4_ + fVar88 * (float)catmullrom_basis0._3964_4_
        ;
        auVar82._24_4_ =
             (float)catmullrom_basis0._500_4_ * fVar28 +
             (float)catmullrom_basis0._1656_4_ * fVar27 +
             fVar85 * (float)catmullrom_basis0._2812_4_ + fVar89 * (float)catmullrom_basis0._3968_4_
        ;
        auVar82._28_4_ =
             (float)catmullrom_basis0._504_4_ +
             (float)catmullrom_basis0._1660_4_ +
             (float)catmullrom_basis0._2816_4_ + (float)catmullrom_basis0._3972_4_;
        fVar73 = (float)catmullrom_basis0._504_4_ + (float)catmullrom_basis0._504_4_ + 0.0;
        fVar64 = (float)catmullrom_basis0._504_4_ +
                 (float)catmullrom_basis0._504_4_ + (float)catmullrom_basis0._3972_4_;
        auVar76._0_4_ =
             fVar11 * (float)catmullrom_basis0._5100_4_ +
             (float)catmullrom_basis0._6256_4_ * fVar2 +
             (float)catmullrom_basis0._8568_4_ * fVar6 + (float)catmullrom_basis0._7412_4_ * fVar3;
        auVar76._4_4_ =
             fVar11 * (float)catmullrom_basis0._5104_4_ +
             (float)catmullrom_basis0._6260_4_ * fVar2 +
             (float)catmullrom_basis0._8572_4_ * fVar6 + (float)catmullrom_basis0._7416_4_ * fVar3;
        auVar76._8_4_ =
             fVar11 * (float)catmullrom_basis0._5108_4_ +
             (float)catmullrom_basis0._6264_4_ * fVar2 +
             (float)catmullrom_basis0._8576_4_ * fVar6 + (float)catmullrom_basis0._7420_4_ * fVar3;
        auVar76._12_4_ =
             fVar11 * (float)catmullrom_basis0._5112_4_ +
             (float)catmullrom_basis0._6268_4_ * fVar2 +
             (float)catmullrom_basis0._8580_4_ * fVar6 + (float)catmullrom_basis0._7424_4_ * fVar3;
        auVar76._16_4_ =
             fVar11 * (float)catmullrom_basis0._5116_4_ +
             (float)catmullrom_basis0._6272_4_ * fVar2 +
             (float)catmullrom_basis0._8584_4_ * fVar6 + (float)catmullrom_basis0._7428_4_ * fVar3;
        auVar76._20_4_ =
             fVar11 * (float)catmullrom_basis0._5120_4_ +
             (float)catmullrom_basis0._6276_4_ * fVar2 +
             (float)catmullrom_basis0._8588_4_ * fVar6 + (float)catmullrom_basis0._7432_4_ * fVar3;
        auVar76._24_4_ =
             fVar11 * (float)catmullrom_basis0._5124_4_ +
             (float)catmullrom_basis0._6280_4_ * fVar2 +
             (float)catmullrom_basis0._8592_4_ * fVar6 + (float)catmullrom_basis0._7436_4_ * fVar3;
        auVar76._28_4_ = (float)catmullrom_basis0._6284_4_ + fVar73;
        auVar78._0_4_ =
             fVar12 * (float)catmullrom_basis0._5100_4_ +
             (float)catmullrom_basis0._6256_4_ * fVar9 +
             (float)catmullrom_basis0._7412_4_ * fVar4 + (float)catmullrom_basis0._8568_4_ * fVar7;
        auVar78._4_4_ =
             fVar12 * (float)catmullrom_basis0._5104_4_ +
             (float)catmullrom_basis0._6260_4_ * fVar9 +
             (float)catmullrom_basis0._7416_4_ * fVar4 + (float)catmullrom_basis0._8572_4_ * fVar7;
        auVar78._8_4_ =
             fVar12 * (float)catmullrom_basis0._5108_4_ +
             (float)catmullrom_basis0._6264_4_ * fVar9 +
             (float)catmullrom_basis0._7420_4_ * fVar4 + (float)catmullrom_basis0._8576_4_ * fVar7;
        auVar78._12_4_ =
             fVar12 * (float)catmullrom_basis0._5112_4_ +
             (float)catmullrom_basis0._6268_4_ * fVar9 +
             (float)catmullrom_basis0._7424_4_ * fVar4 + (float)catmullrom_basis0._8580_4_ * fVar7;
        auVar78._16_4_ =
             fVar12 * (float)catmullrom_basis0._5116_4_ +
             (float)catmullrom_basis0._6272_4_ * fVar9 +
             (float)catmullrom_basis0._7428_4_ * fVar4 + (float)catmullrom_basis0._8584_4_ * fVar7;
        auVar78._20_4_ =
             fVar12 * (float)catmullrom_basis0._5120_4_ +
             (float)catmullrom_basis0._6276_4_ * fVar9 +
             (float)catmullrom_basis0._7432_4_ * fVar4 + (float)catmullrom_basis0._8588_4_ * fVar7;
        auVar78._24_4_ =
             fVar12 * (float)catmullrom_basis0._5124_4_ +
             (float)catmullrom_basis0._6280_4_ * fVar9 +
             (float)catmullrom_basis0._7436_4_ * fVar4 + (float)catmullrom_basis0._8592_4_ * fVar7;
        auVar78._28_4_ = fVar73 + fVar64;
        auVar67._0_4_ =
             (float)catmullrom_basis0._5100_4_ * fVar13 +
             (float)catmullrom_basis0._6256_4_ * fVar10 +
             (float)catmullrom_basis0._7412_4_ * fVar5 + (float)catmullrom_basis0._8568_4_ * fVar8;
        auVar67._4_4_ =
             (float)catmullrom_basis0._5104_4_ * fVar13 +
             (float)catmullrom_basis0._6260_4_ * fVar10 +
             (float)catmullrom_basis0._7416_4_ * fVar5 + (float)catmullrom_basis0._8572_4_ * fVar8;
        auVar67._8_4_ =
             (float)catmullrom_basis0._5108_4_ * fVar13 +
             (float)catmullrom_basis0._6264_4_ * fVar10 +
             (float)catmullrom_basis0._7420_4_ * fVar5 + (float)catmullrom_basis0._8576_4_ * fVar8;
        auVar67._12_4_ =
             (float)catmullrom_basis0._5112_4_ * fVar13 +
             (float)catmullrom_basis0._6268_4_ * fVar10 +
             (float)catmullrom_basis0._7424_4_ * fVar5 + (float)catmullrom_basis0._8580_4_ * fVar8;
        auVar67._16_4_ =
             (float)catmullrom_basis0._5116_4_ * fVar13 +
             (float)catmullrom_basis0._6272_4_ * fVar10 +
             (float)catmullrom_basis0._7428_4_ * fVar5 + (float)catmullrom_basis0._8584_4_ * fVar8;
        auVar67._20_4_ =
             (float)catmullrom_basis0._5120_4_ * fVar13 +
             (float)catmullrom_basis0._6276_4_ * fVar10 +
             (float)catmullrom_basis0._7432_4_ * fVar5 + (float)catmullrom_basis0._8588_4_ * fVar8;
        auVar67._24_4_ =
             (float)catmullrom_basis0._5124_4_ * fVar13 +
             (float)catmullrom_basis0._6280_4_ * fVar10 +
             (float)catmullrom_basis0._7436_4_ * fVar5 + (float)catmullrom_basis0._8592_4_ * fVar8;
        auVar67._28_4_ = fVar64 + fVar86 + (float)catmullrom_basis0._504_4_ + fVar5;
        auVar65._0_4_ =
             (float)catmullrom_basis0._5100_4_ * fVar1 +
             (float)catmullrom_basis0._6256_4_ * fVar25 +
             fVar87 * (float)catmullrom_basis0._8568_4_ + (float)catmullrom_basis0._7412_4_ * fVar83
        ;
        auVar65._4_4_ =
             (float)catmullrom_basis0._5104_4_ * fVar70 +
             (float)catmullrom_basis0._6260_4_ * fVar26 +
             fVar88 * (float)catmullrom_basis0._8572_4_ + (float)catmullrom_basis0._7416_4_ * fVar84
        ;
        auVar65._8_4_ =
             (float)catmullrom_basis0._5108_4_ * fVar28 +
             (float)catmullrom_basis0._6264_4_ * fVar27 +
             fVar89 * (float)catmullrom_basis0._8576_4_ + (float)catmullrom_basis0._7420_4_ * fVar85
        ;
        auVar65._12_4_ =
             (float)catmullrom_basis0._5112_4_ * auVar47._12_4_ +
             (float)catmullrom_basis0._6268_4_ * auVar61._12_4_ +
             auVar71._12_4_ * (float)catmullrom_basis0._8580_4_ +
             (float)catmullrom_basis0._7424_4_ * fVar86;
        auVar65._16_4_ =
             (float)catmullrom_basis0._5116_4_ * fVar1 +
             (float)catmullrom_basis0._6272_4_ * fVar25 +
             fVar87 * (float)catmullrom_basis0._8584_4_ + (float)catmullrom_basis0._7428_4_ * fVar83
        ;
        auVar65._20_4_ =
             (float)catmullrom_basis0._5120_4_ * fVar70 +
             (float)catmullrom_basis0._6276_4_ * fVar26 +
             fVar88 * (float)catmullrom_basis0._8588_4_ + (float)catmullrom_basis0._7432_4_ * fVar84
        ;
        auVar65._24_4_ =
             (float)catmullrom_basis0._5124_4_ * fVar28 +
             (float)catmullrom_basis0._6280_4_ * fVar27 +
             fVar89 * (float)catmullrom_basis0._8592_4_ + (float)catmullrom_basis0._7436_4_ * fVar85
        ;
        auVar65._28_4_ =
             fVar64 + (float)catmullrom_basis0._6284_4_ +
                      (float)catmullrom_basis0._8596_4_ + (float)catmullrom_basis0._7440_4_;
        auVar18 = vblendps_avx(auVar76,ZEXT832(0) << 0x20,1);
        auVar19 = vblendps_avx(auVar78,ZEXT832(0) << 0x20,1);
        auVar63 = ZEXT832(0) << 0x20;
        auVar20 = vblendps_avx(auVar67,auVar63,1);
        auVar21 = vblendps_avx(auVar65,auVar63,1);
        auVar29._4_4_ = auVar18._4_4_ * 0.055555556;
        auVar29._0_4_ = auVar18._0_4_ * 0.055555556;
        auVar29._8_4_ = auVar18._8_4_ * 0.055555556;
        auVar29._12_4_ = auVar18._12_4_ * 0.055555556;
        auVar29._16_4_ = auVar18._16_4_ * 0.055555556;
        auVar29._20_4_ = auVar18._20_4_ * 0.055555556;
        auVar29._24_4_ = auVar18._24_4_ * 0.055555556;
        auVar29._28_4_ = auVar18._28_4_;
        auVar18._4_4_ = auVar19._4_4_ * 0.055555556;
        auVar18._0_4_ = auVar19._0_4_ * 0.055555556;
        auVar18._8_4_ = auVar19._8_4_ * 0.055555556;
        auVar18._12_4_ = auVar19._12_4_ * 0.055555556;
        auVar18._16_4_ = auVar19._16_4_ * 0.055555556;
        auVar18._20_4_ = auVar19._20_4_ * 0.055555556;
        auVar18._24_4_ = auVar19._24_4_ * 0.055555556;
        auVar18._28_4_ = auVar76._28_4_;
        auVar19._4_4_ = auVar20._4_4_ * 0.055555556;
        auVar19._0_4_ = auVar20._0_4_ * 0.055555556;
        auVar19._8_4_ = auVar20._8_4_ * 0.055555556;
        auVar19._12_4_ = auVar20._12_4_ * 0.055555556;
        auVar19._16_4_ = auVar20._16_4_ * 0.055555556;
        auVar19._20_4_ = auVar20._20_4_ * 0.055555556;
        auVar19._24_4_ = auVar20._24_4_ * 0.055555556;
        auVar19._28_4_ = fVar11;
        auVar20._4_4_ = auVar21._4_4_ * 0.055555556;
        auVar20._0_4_ = auVar21._0_4_ * 0.055555556;
        auVar20._8_4_ = auVar21._8_4_ * 0.055555556;
        auVar20._12_4_ = auVar21._12_4_ * 0.055555556;
        auVar20._16_4_ = auVar21._16_4_ * 0.055555556;
        auVar20._20_4_ = auVar21._20_4_ * 0.055555556;
        auVar20._24_4_ = auVar21._24_4_ * 0.055555556;
        auVar20._28_4_ = catmullrom_basis0._5128_4_;
        auVar24._4_4_ = fVar48;
        auVar24._0_4_ = fVar44;
        auVar24._8_4_ = fVar50;
        auVar24._12_4_ = fVar52;
        auVar24._16_4_ = fVar54;
        auVar24._20_4_ = fVar56;
        auVar24._24_4_ = fVar58;
        auVar24._28_4_ = fVar60;
        auVar29 = vsubps_avx(auVar24,auVar29);
        auVar33._4_4_ = fVar49;
        auVar33._0_4_ = fVar45;
        auVar33._8_4_ = fVar51;
        auVar33._12_4_ = fVar53;
        auVar33._16_4_ = fVar55;
        auVar33._20_4_ = fVar57;
        auVar33._24_4_ = fVar59;
        auVar33._28_4_ = fVar68;
        auVar30 = vsubps_avx(auVar33,auVar18);
        auVar31 = vsubps_avx(auVar90,auVar19);
        auVar32 = vsubps_avx(auVar82,auVar20);
        auVar18 = vblendps_avx(auVar63,auVar76,0x7f);
        auVar19 = vblendps_avx(auVar78,auVar63,0x80);
        auVar20 = vblendps_avx(auVar67,ZEXT832(0) << 0x20,0x80);
        auVar21 = vblendps_avx(auVar65,ZEXT832(0) << 0x20,0x80);
        auVar77._0_4_ = auVar18._0_4_ * 0.055555556 + fVar44;
        auVar77._4_4_ = auVar18._4_4_ * 0.055555556 + fVar48;
        auVar77._8_4_ = auVar18._8_4_ * 0.055555556 + fVar50;
        auVar77._12_4_ = auVar18._12_4_ * 0.055555556 + fVar52;
        auVar77._16_4_ = auVar18._16_4_ * 0.055555556 + fVar54;
        auVar77._20_4_ = auVar18._20_4_ * 0.055555556 + fVar56;
        auVar77._24_4_ = auVar18._24_4_ * 0.055555556 + fVar58;
        auVar77._28_4_ = auVar18._28_4_ + fVar60;
        auVar80._0_4_ = auVar19._0_4_ * 0.055555556 + fVar45;
        auVar80._4_4_ = auVar19._4_4_ * 0.055555556 + fVar49;
        auVar80._8_4_ = auVar19._8_4_ * 0.055555556 + fVar51;
        auVar80._12_4_ = auVar19._12_4_ * 0.055555556 + fVar53;
        auVar80._16_4_ = auVar19._16_4_ * 0.055555556 + fVar55;
        auVar80._20_4_ = auVar19._20_4_ * 0.055555556 + fVar57;
        auVar80._24_4_ = auVar19._24_4_ * 0.055555556 + fVar59;
        auVar80._28_4_ = auVar19._28_4_ + fVar68;
        auVar63._0_4_ = auVar90._0_4_ + auVar20._0_4_ * 0.055555556;
        auVar63._4_4_ = auVar90._4_4_ + auVar20._4_4_ * 0.055555556;
        auVar63._8_4_ = auVar90._8_4_ + auVar20._8_4_ * 0.055555556;
        auVar63._12_4_ = auVar90._12_4_ + auVar20._12_4_ * 0.055555556;
        auVar63._16_4_ = auVar90._16_4_ + auVar20._16_4_ * 0.055555556;
        auVar63._20_4_ = auVar90._20_4_ + auVar20._20_4_ * 0.055555556;
        auVar63._24_4_ = auVar90._24_4_ + auVar20._24_4_ * 0.055555556;
        auVar63._28_4_ = auVar90._28_4_ + auVar20._28_4_;
        auVar66._0_4_ = auVar82._0_4_ + auVar21._0_4_ * 0.055555556;
        auVar66._4_4_ = auVar82._4_4_ + auVar21._4_4_ * 0.055555556;
        auVar66._8_4_ = auVar82._8_4_ + auVar21._8_4_ * 0.055555556;
        auVar66._12_4_ = auVar82._12_4_ + auVar21._12_4_ * 0.055555556;
        auVar66._16_4_ = auVar82._16_4_ + auVar21._16_4_ * 0.055555556;
        auVar66._20_4_ = auVar82._20_4_ + auVar21._20_4_ * 0.055555556;
        auVar66._24_4_ = auVar82._24_4_ + auVar21._24_4_ * 0.055555556;
        auVar66._28_4_ = auVar82._28_4_ + auVar21._28_4_;
        auVar91._8_4_ = 0x7f800000;
        auVar91._0_8_ = 0x7f8000007f800000;
        auVar91._12_4_ = 0x7f800000;
        auVar91._16_4_ = 0x7f800000;
        auVar91._20_4_ = 0x7f800000;
        auVar91._24_4_ = 0x7f800000;
        auVar91._28_4_ = 0x7f800000;
        auVar18 = vminps_avx(auVar91,auVar24);
        auVar19 = vminps_avx(auVar91,auVar33);
        auVar20 = vminps_avx(auVar91,auVar90);
        auVar21 = vminps_avx(auVar29,auVar77);
        auVar24 = vminps_avx(auVar18,auVar21);
        auVar18 = vminps_avx(auVar30,auVar80);
        auVar65 = vminps_avx(auVar19,auVar18);
        auVar18 = vminps_avx(auVar31,auVar63);
        auVar67 = vminps_avx(auVar20,auVar18);
        auVar18 = vminps_avx(auVar91,auVar82);
        auVar19 = vminps_avx(auVar32,auVar66);
        auVar76 = vminps_avx(auVar18,auVar19);
        auVar18 = vmaxps_avx(auVar29,auVar77);
        auVar92._8_4_ = 0xff800000;
        auVar92._0_8_ = 0xff800000ff800000;
        auVar92._12_4_ = 0xff800000;
        auVar92._16_4_ = 0xff800000;
        auVar92._20_4_ = 0xff800000;
        auVar92._24_4_ = 0xff800000;
        auVar92._28_4_ = 0xff800000;
        auVar21._4_4_ = fVar48;
        auVar21._0_4_ = fVar44;
        auVar21._8_4_ = fVar50;
        auVar21._12_4_ = fVar52;
        auVar21._16_4_ = fVar54;
        auVar21._20_4_ = fVar56;
        auVar21._24_4_ = fVar58;
        auVar21._28_4_ = fVar60;
        auVar19 = vmaxps_avx(auVar92,auVar21);
        auVar18 = vmaxps_avx(auVar19,auVar18);
        auVar19 = vmaxps_avx(auVar30,auVar80);
        auVar79._8_4_ = 0x7fffffff;
        auVar79._0_8_ = 0x7fffffff7fffffff;
        auVar79._12_4_ = 0x7fffffff;
        auVar81 = ZEXT1664(auVar79);
        auVar20 = vmaxps_avx(auVar92,auVar33);
        auVar19 = vmaxps_avx(auVar20,auVar19);
        auVar20 = vmaxps_avx(auVar31,auVar63);
        auVar21 = vmaxps_avx(auVar92,auVar90);
        auVar20 = vmaxps_avx(auVar21,auVar20);
        auVar21 = vmaxps_avx(auVar32,auVar66);
        auVar29 = vmaxps_avx(auVar92,auVar82);
        auVar21 = vmaxps_avx(auVar29,auVar21);
        auVar29 = vshufps_avx(auVar24,auVar24,0xb1);
        auVar29 = vminps_avx(auVar24,auVar29);
        auVar24 = vshufpd_avx(auVar29,auVar29,5);
        auVar29 = vminps_avx(auVar29,auVar24);
        auVar61 = vminps_avx(auVar29._0_16_,auVar29._16_16_);
        auVar29 = vshufps_avx(auVar65,auVar65,0xb1);
        auVar29 = vminps_avx(auVar65,auVar29);
        auVar24 = vshufpd_avx(auVar29,auVar29,5);
        auVar29 = vminps_avx(auVar29,auVar24);
        auVar71 = vminps_avx(auVar29._0_16_,auVar29._16_16_);
        auVar71 = vunpcklps_avx(auVar61,auVar71);
        auVar29 = vshufps_avx(auVar67,auVar67,0xb1);
        auVar29 = vminps_avx(auVar67,auVar29);
        auVar24 = vshufpd_avx(auVar29,auVar29,5);
        auVar29 = vminps_avx(auVar29,auVar24);
        auVar61 = vminps_avx(auVar29._0_16_,auVar29._16_16_);
        auVar47 = vinsertps_avx(auVar71,auVar61,0x28);
        auVar29 = vshufps_avx(auVar18,auVar18,0xb1);
        auVar18 = vmaxps_avx(auVar18,auVar29);
        auVar29 = vshufpd_avx(auVar18,auVar18,5);
        auVar18 = vmaxps_avx(auVar18,auVar29);
        auVar61 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
        auVar18 = vshufps_avx(auVar19,auVar19,0xb1);
        auVar18 = vmaxps_avx(auVar19,auVar18);
        auVar19 = vshufpd_avx(auVar18,auVar18,5);
        auVar18 = vmaxps_avx(auVar18,auVar19);
        auVar71 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
        auVar71 = vunpcklps_avx(auVar61,auVar71);
        auVar18 = vshufps_avx(auVar20,auVar20,0xb1);
        auVar18 = vmaxps_avx(auVar20,auVar18);
        auVar19 = vshufpd_avx(auVar18,auVar18,5);
        auVar18 = vmaxps_avx(auVar18,auVar19);
        auVar61 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
        auVar62 = vinsertps_avx(auVar71,auVar61,0x28);
        auVar18 = vshufps_avx(auVar76,auVar76,0xb1);
        auVar18 = vminps_avx(auVar76,auVar18);
        auVar19 = vshufpd_avx(auVar18,auVar18,5);
        auVar18 = vminps_avx(auVar18,auVar19);
        auVar61 = vminss_avx(auVar18._0_16_,auVar18._16_16_);
        auVar18 = vshufps_avx(auVar21,auVar21,0xb1);
        auVar18 = vmaxps_avx(auVar21,auVar18);
        auVar19 = vshufpd_avx(auVar18,auVar18,5);
        auVar18 = vmaxps_avx(auVar18,auVar19);
        auVar71 = vmaxss_avx(auVar18._0_16_,auVar18._16_16_);
        auVar61 = vandps_avx(auVar79,auVar61);
        auVar71 = vandps_avx(auVar79,auVar71);
        auVar61 = vmaxss_avx(auVar71,auVar61);
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar47 = vsubps_avx(auVar47,auVar61);
        auVar46._0_4_ = auVar62._0_4_ + auVar61._0_4_;
        auVar46._4_4_ = auVar62._4_4_ + auVar61._4_4_;
        auVar46._8_4_ = auVar62._8_4_ + auVar61._8_4_;
        auVar46._12_4_ = auVar62._12_4_ + auVar61._12_4_;
        auVar61 = vandps_avx(auVar79,auVar47);
        auVar71 = vandps_avx(auVar79,auVar46);
        auVar61 = vmaxps_avx(auVar61,auVar71);
        auVar71 = vmovshdup_avx(auVar61);
        auVar71 = vmaxss_avx(auVar71,auVar61);
        auVar61 = vshufpd_avx(auVar61,auVar61,1);
        auVar61 = vmaxss_avx(auVar61,auVar71);
        auVar61 = ZEXT416((uint)(auVar61._0_4_ * 4.7683716e-07));
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        auVar71 = vsubps_avx(auVar47,auVar61);
        aVar22 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar71,ZEXT416(geomID),0x30);
        auVar47._0_4_ = auVar46._0_4_ + auVar61._0_4_;
        auVar47._4_4_ = auVar46._4_4_ + auVar61._4_4_;
        auVar47._8_4_ = auVar46._8_4_ + auVar61._8_4_;
        auVar47._12_4_ = auVar46._12_4_ + auVar61._12_4_;
        aVar23 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar47,ZEXT416((uint)uVar38),0x30);
        auVar62._0_4_ = aVar22.x + aVar23.x;
        auVar62._4_4_ = aVar22.y + aVar23.y;
        auVar62._8_4_ = aVar22.z + aVar23.z;
        auVar62._12_4_ = aVar22.field_3.w + aVar23.field_3.w;
        local_238 = vminps_avx(local_238,auVar62);
        local_248 = vmaxps_avx(local_248,auVar62);
        auVar61 = vmaxps_avx(auVar69._0_16_,(undefined1  [16])aVar23);
        auVar69 = ZEXT1664(auVar61);
        prims[local_250].upper.field_0.field_1 = aVar23;
        auVar61 = vminps_avx(auVar72._0_16_,(undefined1  [16])aVar22);
        auVar72 = ZEXT1664(auVar61);
        prims[local_250].lower.field_0.field_1 = aVar22;
        local_258 = local_258 + 1;
        uVar36 = r->_end;
        local_250 = local_250 + 1;
      }
LAB_01238a48:
      auVar61 = auVar69._0_16_;
      auVar71 = auVar72._0_16_;
      uVar38 = uVar38 + 1;
    } while (uVar38 < uVar36);
  }
  else {
    auVar71._8_4_ = 0x7f800000;
    auVar71._0_8_ = 0x7f8000007f800000;
    auVar71._12_4_ = 0x7f800000;
    auVar61._8_4_ = 0xff800000;
    auVar61._0_8_ = 0xff800000ff800000;
    auVar61._12_4_ = 0xff800000;
    local_258 = 0;
    local_248 = auVar61;
    local_238 = auVar71;
  }
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = auVar71;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = auVar61;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_238._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_238._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_248._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_248._8_8_;
  __return_storage_ptr__->end = local_258;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }